

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple.c
# Opt level: O0

int main(void)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int local_24;
  int local_20;
  int height;
  int width;
  float ratio;
  GLFWwindow *window;
  undefined8 extraout_XMM0_Qb;
  
  window._4_4_ = 0;
  glfwSetErrorCallback(error_callback);
  iVar1 = glfwInit();
  if (iVar1 == 0) {
    exit(1);
  }
  _width = glfwCreateWindow(0x280,0x1e0,"Simple example",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  if (_width == (GLFWwindow *)0x0) {
    glfwTerminate();
    exit(1);
  }
  glfwMakeContextCurrent(_width);
  glfwSwapInterval(1);
  glfwSetKeyCallback(_width,key_callback);
  while( true ) {
    iVar1 = glfwWindowShouldClose(_width);
    if (iVar1 != 0) break;
    glfwGetFramebufferSize(_width,&local_20,&local_24);
    height = (int)((float)local_20 / (float)local_24);
    glViewport(0,0,local_20,local_24);
    glClear(0x4000);
    glMatrixMode(0x1701);
    glLoadIdentity();
    glOrtho((double)-(float)height,(double)(float)height,0,0);
    glMatrixMode(0x1700);
    glLoadIdentity();
    auVar2._0_8_ = glfwGetTime();
    auVar2._8_8_ = extraout_XMM0_Qb;
    auVar3._4_12_ = auVar2._4_12_;
    auVar3._0_4_ = (float)auVar2._0_8_ * 50.0;
    glRotatef(auVar3._0_8_,0,0,0x3f800000);
    glBegin(4);
    glColor3f();
    glVertex3f();
    glColor3f();
    glVertex3f();
    glColor3f();
    glVertex3f();
    glEnd();
    glfwSwapBuffers(_width);
    glfwPollEvents();
  }
  glfwDestroyWindow(_width);
  glfwTerminate();
  exit(0);
}

Assistant:

int main(void)
{
    GLFWwindow* window;

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    window = glfwCreateWindow(640, 480, "Simple example", NULL, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwMakeContextCurrent(window);
    glfwSwapInterval(1);

    glfwSetKeyCallback(window, key_callback);

    while (!glfwWindowShouldClose(window))
    {
        float ratio;
        int width, height;

        glfwGetFramebufferSize(window, &width, &height);
        ratio = width / (float) height;

        glViewport(0, 0, width, height);
        glClear(GL_COLOR_BUFFER_BIT);

        glMatrixMode(GL_PROJECTION);
        glLoadIdentity();
        glOrtho(-ratio, ratio, -1.f, 1.f, 1.f, -1.f);
        glMatrixMode(GL_MODELVIEW);

        glLoadIdentity();
        glRotatef((float) glfwGetTime() * 50.f, 0.f, 0.f, 1.f);

        glBegin(GL_TRIANGLES);
        glColor3f(1.f, 0.f, 0.f);
        glVertex3f(-0.6f, -0.4f, 0.f);
        glColor3f(0.f, 1.f, 0.f);
        glVertex3f(0.6f, -0.4f, 0.f);
        glColor3f(0.f, 0.f, 1.f);
        glVertex3f(0.f, 0.6f, 0.f);
        glEnd();

        glfwSwapBuffers(window);
        glfwPollEvents();
    }

    glfwDestroyWindow(window);

    glfwTerminate();
    exit(EXIT_SUCCESS);
}